

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::RgbaOutputFile::ToYca::writePixels(ToYca *this,int numScanLines)

{
  Rgba *pRVar1;
  ostream *poVar2;
  char *pcVar3;
  ArgExc *this_00;
  int *piVar4;
  int in_ESI;
  ToYca *in_RDI;
  int j_4;
  int j_3;
  int j_2;
  Rgba *ptr;
  int j_1;
  intptr_t base_1;
  int i_1;
  int j;
  int i;
  intptr_t base;
  stringstream _iex_throw_s;
  int in_stack_0000008c;
  OutputFile *in_stack_00000090;
  ToYca *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  Rgba *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  int iVar5;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  Rgba *in_stack_fffffffffffffe60;
  Rgba *in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe74;
  ostream local_188 [380];
  int local_c;
  
  if (in_RDI->_fbBase != (Rgba *)0x0) {
    pRVar1 = in_RDI->_fbBase;
    local_c = in_ESI;
    if (((in_RDI->_writeY & 1U) == 0) || ((in_RDI->_writeC & 1U) != 0)) {
      for (local_1bc = 0; local_1bc < local_c; local_1bc = local_1bc + 1) {
        pRVar1 = in_RDI->_fbBase;
        for (iVar5 = 0; iVar5 < in_RDI->_width; iVar5 = iVar5 + 1) {
          in_stack_fffffffffffffe28 =
               pRVar1 + in_RDI->_fbYStride * (long)in_RDI->_currentScanLine +
                        in_RDI->_fbXStride * (long)(iVar5 + in_RDI->_xMin);
          in_RDI->_tmpBuf[iVar5 + 0xd] = *in_stack_fffffffffffffe28;
        }
        RgbaYca::RGBAtoYCA((V3f *)CONCAT44(iVar5,in_stack_fffffffffffffe30),
                           (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                           SUB81((ulong)in_stack_fffffffffffffe28 >> 0x18,0),
                           (Rgba *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           (Rgba *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        padTmpBuf(in_RDI);
        rotateBuffers(in_RDI);
        RgbaYca::decimateChromaHoriz
                  (in_stack_fffffffffffffe74,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
        if (in_RDI->_linesConverted == 0) {
          for (in_stack_fffffffffffffe24 = 0; in_stack_fffffffffffffe24 < 0xd;
              in_stack_fffffffffffffe24 = in_stack_fffffffffffffe24 + 1) {
            duplicateLastBuffer(in_stack_fffffffffffffdf0);
          }
        }
        in_RDI->_linesConverted = in_RDI->_linesConverted + 1;
        if (0xd < in_RDI->_linesConverted) {
          decimateChromaVertAndWriteScanLine(in_stack_fffffffffffffdf0);
        }
        if (in_RDI->_height <= in_RDI->_linesConverted) {
          for (in_stack_fffffffffffffe20 = 0; in_stack_fffffffffffffe20 < 0xd - in_RDI->_height;
              in_stack_fffffffffffffe20 = in_stack_fffffffffffffe20 + 1) {
            duplicateLastBuffer(in_stack_fffffffffffffdf0);
          }
          duplicateSecondToLastBuffer(in_stack_fffffffffffffdf0);
          in_RDI->_linesConverted = in_RDI->_linesConverted + 1;
          decimateChromaVertAndWriteScanLine(in_stack_fffffffffffffdf0);
          iVar5 = 1;
          while (in_stack_fffffffffffffe1c = iVar5,
                piVar4 = std::min<int>(&in_RDI->_height,&RgbaYca::N2), iVar5 < *piVar4) {
            duplicateLastBuffer(in_stack_fffffffffffffdf0);
            in_RDI->_linesConverted = in_RDI->_linesConverted + 1;
            decimateChromaVertAndWriteScanLine(in_stack_fffffffffffffdf0);
            iVar5 = in_stack_fffffffffffffe1c + 1;
          }
        }
        if (in_RDI->_lineOrder == INCREASING_Y) {
          in_RDI->_currentScanLine = in_RDI->_currentScanLine + 1;
        }
        else {
          in_RDI->_currentScanLine = in_RDI->_currentScanLine + -1;
        }
      }
    }
    else {
      for (local_1b4 = 0; local_1b4 < local_c; local_1b4 = local_1b4 + 1) {
        for (local_1b8 = 0; local_1b8 < in_RDI->_width; local_1b8 = local_1b8 + 1) {
          in_RDI->_tmpBuf[local_1b8] =
               pRVar1[in_RDI->_fbYStride * (long)in_RDI->_currentScanLine +
                      in_RDI->_fbXStride * (long)(local_1b8 + in_RDI->_xMin)];
        }
        RgbaYca::RGBAtoYCA((V3f *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                           (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                           SUB81((ulong)in_stack_fffffffffffffe28 >> 0x18,0),
                           (Rgba *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           (Rgba *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        OutputFile::writePixels(in_stack_00000090,in_stack_0000008c);
        in_RDI->_linesConverted = in_RDI->_linesConverted + 1;
        if (in_RDI->_lineOrder == INCREASING_Y) {
          in_RDI->_currentScanLine = in_RDI->_currentScanLine + 1;
        }
        else {
          in_RDI->_currentScanLine = in_RDI->_currentScanLine + -1;
        }
      }
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe68);
  poVar2 = std::operator<<(local_188,
                           "No frame buffer was specified as the pixel data source for image file \""
                          );
  pcVar3 = OutputFile::fileName((OutputFile *)0x21e74e);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,"\".");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&stack0xfffffffffffffe68);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
RgbaOutputFile::ToYca::writePixels (int numScanLines)
{
    if (_fbBase == 0)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "No frame buffer was specified as the "
            "pixel data source for image file "
            "\"" << _outputFile.fileName ()
                 << "\".");
    }

    intptr_t base = reinterpret_cast<intptr_t> (_fbBase);
    if (_writeY && !_writeC)
    {
        //
        // We are writing only luminance; filtering
        // and subsampling are not necessary.
        //

        for (int i = 0; i < numScanLines; ++i)
        {
            //
            // Copy the next scan line from the caller's
            // frame buffer into _tmpBuf.
            //

            for (int j = 0; j < _width; ++j)
            {
                _tmpBuf[j] = *reinterpret_cast<Rgba*> (
                    base + sizeof (Rgba) * (_fbYStride * _currentScanLine +
                                            _fbXStride * (j + _xMin)));
            }

            //
            // Convert the scan line from RGB to luminance/chroma,
            // and store the result in the output file.
            //

            RGBAtoYCA (_yw, _width, _writeA, _tmpBuf, _tmpBuf);
            _outputFile.writePixels (1);

            ++_linesConverted;

            if (_lineOrder == INCREASING_Y)
                ++_currentScanLine;
            else
                --_currentScanLine;
        }
    }
    else
    {
        //
        // We are writing chroma; the pixels must be filtered and subsampled.
        //

        for (int i = 0; i < numScanLines; ++i)
        {
            //
            // Copy the next scan line from the caller's
            // frame buffer into _tmpBuf.
            //

            intptr_t base = reinterpret_cast<intptr_t> (_fbBase);

            for (int j = 0; j < _width; ++j)
            {
                const Rgba* ptr = reinterpret_cast<const Rgba*> (
                    base + sizeof (Rgba) * (_fbYStride * _currentScanLine +
                                            _fbXStride * (j + _xMin)));
                _tmpBuf[j + N2] = *ptr;
            }

            //
            // Convert the scan line from RGB to luminance/chroma.
            //

            RGBAtoYCA (_yw, _width, _writeA, _tmpBuf + N2, _tmpBuf + N2);

            //
            // Append N2 copies of the first and last pixel to the
            // beginning and end of the scan line.
            //

            padTmpBuf ();

            //
            // Filter and subsample the scan line's chroma channels
            // horizontally; store the result in _buf.
            //

            rotateBuffers ();
            decimateChromaHoriz (_width, _tmpBuf, _buf[N - 1]);

            //
            // If this is the first scan line in the image,
            // store N2 more copies of the scan line in _buf.
            //

            if (_linesConverted == 0)
            {
                for (int j = 0; j < N2; ++j)
                    duplicateLastBuffer ();
            }

            ++_linesConverted;

            //
            // If we have have converted at least N2 scan lines from
            // RGBA to luminance/chroma, then we can start to filter
            // and subsample vertically, and store pixels in the
            // output file.
            //

            if (_linesConverted > N2) decimateChromaVertAndWriteScanLine ();

            //
            // If we have already converted the last scan line in
            // the image to luminance/chroma, filter, subsample and
            // store the remaining scan lines in _buf.
            //

            if (_linesConverted >= _height)
            {
                for (int j = 0; j < N2 - _height; ++j)
                    duplicateLastBuffer ();

                duplicateSecondToLastBuffer ();
                ++_linesConverted;
                decimateChromaVertAndWriteScanLine ();

                for (int j = 1; j < min (_height, N2); ++j)
                {
                    duplicateLastBuffer ();
                    ++_linesConverted;
                    decimateChromaVertAndWriteScanLine ();
                }
            }

            if (_lineOrder == INCREASING_Y)
                ++_currentScanLine;
            else
                --_currentScanLine;
        }
    }
}